

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage3d_invalid_buffer_target
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  int iVar2;
  size_type __n;
  long size;
  reference data_00;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  GLuint local_18;
  GLsizei bufferSize;
  deUint32 texture;
  deUint32 buf;
  NegativeTestContext *ctx_local;
  
  bufferSize = 0x1234;
  local_18 = 0x1234;
  _texture = ctx;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = etc2EacDataSize(4,4);
  __n = (size_type)
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__n,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  glu::CallLogWrapper::glGenTextures(&_texture->super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindTexture(&_texture->super_CallLogWrapper,0x8c1a,local_18);
  pNVar1 = _texture;
  iVar2 = etc2EacDataSize(0x10,0x10);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0x9278,0x10,0x10,1,0,iVar2,(void *)0x0);
  glu::CallLogWrapper::glGenBuffers(&_texture->super_CallLogWrapper,1,(GLuint *)&bufferSize);
  glu::CallLogWrapper::glBindBuffer(&_texture->super_CallLogWrapper,0x88ec,bufferSize);
  pNVar1 = _texture;
  size = (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
  data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  glu::CallLogWrapper::glBufferData(&pNVar1->super_CallLogWrapper,0x88ec,size,data_00,0x88ea);
  NegativeTestContext::expectError(_texture,0);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and..."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"...the buffer object\'s data store is currently mapped.",&local_99
            );
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glMapBufferRange
            (&_texture->super_CallLogWrapper,0x88ec,0,
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,2);
  pNVar1 = _texture;
  iVar2 = etc2EacDataSize(4,4);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0,0,0,4,4,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(_texture,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&_texture->super_CallLogWrapper,0x88ec);
  NegativeTestContext::endSection(_texture);
  pNVar1 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pNVar1 = _texture;
  iVar2 = etc2EacDataSize(0x10,0x10);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&pNVar1->super_CallLogWrapper,0x8c1a,0,0,0,0,0x10,0x10,1,0x9278,iVar2,(void *)0x0);
  NegativeTestContext::expectError(_texture,0x502);
  NegativeTestContext::endSection(_texture);
  NegativeTestContext::endSection(_texture);
  glu::CallLogWrapper::glDeleteBuffers(&_texture->super_CallLogWrapper,1,(GLuint *)&bufferSize);
  glu::CallLogWrapper::glDeleteTextures(&_texture->super_CallLogWrapper,1,&local_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void compressedtexsubimage3d_invalid_buffer_target (NegativeTestContext& ctx)
{
	deUint32						buf = 0x1234;
	deUint32						texture = 0x1234;
	GLsizei							bufferSize =  etc2EacDataSize(4, 4);
	std::vector<GLubyte>			data(bufferSize);

	ctx.glGenTextures				(1, &texture);
	ctx.glBindTexture				(GL_TEXTURE_2D_ARRAY, texture);
	ctx.glCompressedTexImage3D		(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 16, 16, 1, 0, etc2EacDataSize(16, 16), 0);
	ctx.glGenBuffers				(1, &buf);
	ctx.glBindBuffer				(GL_PIXEL_UNPACK_BUFFER, buf);
	ctx.glBufferData				(GL_PIXEL_UNPACK_BUFFER, bufferSize, &data[0], GL_DYNAMIC_COPY);
	ctx.expectError					(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and...");
	ctx.beginSection("...the buffer object's data store is currently mapped.");
	ctx.glMapBufferRange			(GL_PIXEL_UNPACK_BUFFER, 0, bufferSize, GL_MAP_WRITE_BIT);
	ctx.glCompressedTexSubImage3D	(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 4, 4, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(4, 4), 0);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer				(GL_PIXEL_UNPACK_BUFFER);
	ctx.endSection();

	ctx.beginSection("...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size.");
	ctx.glCompressedTexSubImage3D	(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 16, 16, 1, GL_COMPRESSED_RGBA8_ETC2_EAC, etc2EacDataSize(16, 16), 0);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.endSection();
	ctx.endSection();

	ctx.glDeleteBuffers			(1, &buf);
	ctx.glDeleteTextures		(1, &texture);
}